

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O0

void __thiscall
TEST_MockPlugin_checkExpectationsAndClearAtEnd_TestShell::
~TEST_MockPlugin_checkExpectationsAndClearAtEnd_TestShell
          (TEST_MockPlugin_checkExpectationsAndClearAtEnd_TestShell *this)

{
  TEST_MockPlugin_checkExpectationsAndClearAtEnd_TestShell *this_local;
  
  ~TEST_MockPlugin_checkExpectationsAndClearAtEnd_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockPlugin, checkExpectationsAndClearAtEnd)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foobar");
    MockExpectedCallsDidntHappenFailure expectedFailure(test, expectations);

    mock().expectOneCall("foobar");

    plugin.postTestAction(*test, *result);

    STRCMP_CONTAINS(expectedFailure.getMessage().asCharString(), output.getOutput().asCharString());
    LONGS_EQUAL(0, mock().expectedCallsLeft());
    CHECK_NO_MOCK_FAILURE();
}